

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::~SparseArray(SparseArray<re2::NFA::Thread_*> *this)

{
  std::
  unique_ptr<re2::SparseArray<re2::NFA::Thread_*>::IndexValue[],_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
  ::~unique_ptr(&(this->dense_).ptr_);
  std::unique_ptr<int[],_re2::PODArray<int>::Deleter>::~unique_ptr(&(this->sparse_).ptr_);
  return;
}

Assistant:

SparseArray<Value>::~SparseArray() {
  DebugCheckInvariants();
}